

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_info.hpp
# Opt level: O3

void __thiscall mp::FlatModelInfoImpl::InitConstraintCount(FlatModelInfoImpl *this)

{
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->cg_map_)._M_h);
  std::
  _Hashtable<std::reference_wrapper<const_std::type_info>,_std::pair<const_std::reference_wrapper<const_std::type_info>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::type_info>,_int>_>,_std::__detail::_Select1st,_mp::FlatModelInfoImpl::TypeInfoRefEqualTo,_mp::FlatModelInfoImpl::TypeInfoRefHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->ti_map_)._M_h);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
  ::clear(&(this->coninfo_map_)._M_t);
  return;
}

Assistant:

void InitConstraintCount() override
  { cg_map_.clear(); ti_map_.clear(); coninfo_map_.clear(); }